

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.cpp
# Opt level: O2

int call_orderTM(lua_State *L,TValue *p1,TValue *p2,TMS event)

{
  int iVar1;
  TValue *t1;
  TValue *t2;
  uint uVar2;
  
  t1 = luaT_gettmbyobj(L,p1,event);
  uVar2 = 0xffffffff;
  if (t1->tt != 0) {
    t2 = luaT_gettmbyobj(L,p2,event);
    iVar1 = luaO_rawequalObj(t1,t2);
    if (iVar1 != 0) {
      callTMres(L,L->top,t1,p1,p2);
      uVar2 = L->top->tt;
      if (uVar2 != 0) {
        if (uVar2 == 1) {
          uVar2 = (uint)((L->top->value).b != 0);
        }
        else {
          uVar2 = 1;
        }
      }
    }
  }
  return uVar2;
}

Assistant:

static int call_orderTM (lua_State *L, const TValue *p1, const TValue *p2,
                         TMS event) {
  const TValue *tm1 = luaT_gettmbyobj(L, p1, event);
  const TValue *tm2;
  if (ttisnil(tm1)) return -1;  /* no metamethod? */
  tm2 = luaT_gettmbyobj(L, p2, event);
  if (!luaO_rawequalObj(tm1, tm2))  /* different metamethods? */
    return -1;
  callTMres(L, L->top, tm1, p1, p2);
  return !l_isfalse(L->top);
}